

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astUnexpandedSExpressionNode_primitiveAnalyzeAndEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  size_t sVar1;
  sysbvm_tuple_t sVar2;
  size_t elementCount;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_24_3_c3ddf0e2 gcFrame;
  sysbvm_astUnexpandedSExpressionNode_t **unexpandedSExpressionNode;
  sysbvm_tuple_t *environment;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  memset(&gcFrameRecord.roots,0,0x18);
  memset(&sourcePositionRecord.sourcePosition,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_JIT_FUNCTION_ACTIVATION;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  elementCount = 0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&elementCount);
  sVar1 = sysbvm_array_getSize(*(sysbvm_tuple_t *)(*arguments + 0x28));
  if (sVar1 == 0) {
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&elementCount);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
    context_local = (sysbvm_context_t *)sysbvm_array_create(context,0);
  }
  else {
    gcFrameRecord.roots =
         (sysbvm_tuple_t *)sysbvm_array_at(*(sysbvm_tuple_t *)(*arguments + 0x28),0);
    sVar2 = sysbvm_array_fromOffset(context,*(sysbvm_tuple_t *)(*arguments + 0x28),1);
    sVar2 = sysbvm_astUnexpandedApplicationNode_create
                      (context,*(sysbvm_tuple_t *)(*arguments + 0x10),
                       (sysbvm_tuple_t)gcFrameRecord.roots,sVar2);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&elementCount);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
    context_local =
         (sysbvm_context_t *)
         sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context,sVar2,arguments[1]);
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

static sysbvm_tuple_t sysbvm_astUnexpandedSExpressionNode_primitiveAnalyzeAndEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astUnexpandedSExpressionNode_t **unexpandedSExpressionNode = (sysbvm_astUnexpandedSExpressionNode_t**)node;

    struct {
        sysbvm_tuple_t functionOrMacroExpression;
        sysbvm_tuple_t argumentExpressions;
        sysbvm_tuple_t unexpandedApplicationNode;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*unexpandedSExpressionNode)->super.sourcePosition);

    size_t elementCount = sysbvm_array_getSize((*unexpandedSExpressionNode)->elements);
    if(elementCount == 0)
    {
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return sysbvm_array_create(context, 0);
    }
    else
    {
        // Unexpanded application node.
        gcFrame.functionOrMacroExpression = sysbvm_array_at((*unexpandedSExpressionNode)->elements, 0);
        gcFrame.argumentExpressions = sysbvm_array_fromOffset(context, (*unexpandedSExpressionNode)->elements, 1);
        gcFrame.unexpandedApplicationNode = sysbvm_astUnexpandedApplicationNode_create(context, (*unexpandedSExpressionNode)->super.sourcePosition, gcFrame.functionOrMacroExpression, gcFrame.argumentExpressions);
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, gcFrame.unexpandedApplicationNode, *environment);
    }
}